

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool anon_unknown.dwarf_3b3964::getStreamContents
               (InputStream *stream,vector<char,_std::allocator<char>_> *buffer)

{
  long lVar1;
  reference pvVar2;
  long lVar3;
  vector<char,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  Int64 read;
  Int64 size;
  bool success;
  long *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar4;
  
  bVar4 = 1;
  lVar1 = (**(code **)(*in_RDI + 0x28))();
  if (0 < lVar1) {
    std::vector<char,_std::allocator<char>_>::resize
              (in_RSI,CONCAT17(bVar4,in_stack_ffffffffffffffe8));
    (**(code **)(*in_RDI + 0x18))(in_RDI,0);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](in_RSI,0);
    lVar3 = (**(code **)(*in_RDI + 0x10))(in_RDI,pvVar2,lVar1);
    bVar4 = lVar3 == lVar1;
    in_stack_ffffffffffffffc8 = in_RDI;
  }
  std::vector<char,_std::allocator<char>_>::push_back
            ((vector<char,_std::allocator<char>_> *)(ulong)in_stack_ffffffffffffffd0,
             (value_type *)in_stack_ffffffffffffffc8);
  return (bool)(bVar4 & 1);
}

Assistant:

bool getStreamContents(sf::InputStream& stream, std::vector<char>& buffer)
    {
        bool success = true;
        sf::Int64 size = stream.getSize();
        if (size > 0)
        {
            buffer.resize(static_cast<std::size_t>(size));
            stream.seek(0);
            sf::Int64 read = stream.read(&buffer[0], size);
            success = (read == size);
        }
        buffer.push_back('\0');
        return success;
    }